

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void llb_set_quality_of_service(llb_quality_of_service_t level)

{
  bool bVar1;
  QualityOfService *pQVar2;
  OptionalStorage<llbuild::basic::QualityOfService,_true> local_14;
  Optional<llbuild::basic::QualityOfService> qos;
  llb_quality_of_service_t level_local;
  
  qos.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)level;
  if (level == llb_quality_of_service_unspecified) {
    __assert_fail("level != llb_quality_of_service_unspecified",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x5d5,"void llb_set_quality_of_service(llb_quality_of_service_t)");
  }
  local_14 = (OptionalStorage<llbuild::basic::QualityOfService,_true>)getQoSFromLLBQoS(level);
  bVar1 = llvm::Optional<llbuild::basic::QualityOfService>::hasValue
                    ((Optional<llbuild::basic::QualityOfService> *)&local_14);
  if (bVar1) {
    pQVar2 = llvm::Optional<llbuild::basic::QualityOfService>::getValue
                       ((Optional<llbuild::basic::QualityOfService> *)&local_14);
    llbuild::basic::setDefaultQualityOfService(*pQVar2);
  }
  return;
}

Assistant:

void llb_set_quality_of_service(llb_quality_of_service_t level) {
  assert(level != llb_quality_of_service_unspecified);
  Optional<QualityOfService> qos = getQoSFromLLBQoS(level);
  if (qos.hasValue())
    setDefaultQualityOfService(qos.getValue());
}